

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprintint.h
# Opt level: O2

int print_uint16(uint16_t n,char *p)

{
  int iVar1;
  uint16_t uVar2;
  uint uVar3;
  char *pcVar4;
  bool bVar5;
  
  if (n < 1000) {
    if (n < 100) {
      bVar5 = n < 10;
      iVar1 = 1;
      goto LAB_001121d3;
    }
    p[3] = '\0';
    pcVar4 = p + 3;
    uVar3 = 3;
  }
  else {
    bVar5 = n < 10000;
    iVar1 = 4;
LAB_001121d3:
    uVar3 = (iVar1 + 1) - (uint)bVar5;
    pcVar4 = p + uVar3;
    p[uVar3] = '\0';
    if ((uVar3 & 1) == 0) {
      uVar2 = n;
      if (uVar3 != 2) {
        if (uVar3 != 4) {
          return uVar3;
        }
        uVar2 = n / 100;
        *(undefined2 *)(pcVar4 + -2) =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + (ulong)(n % 100) * 2);
        pcVar4 = pcVar4 + -2;
      }
      *(undefined2 *)(pcVar4 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (ulong)(uVar2 % 100) * 2);
      return uVar3;
    }
    uVar2 = n;
    if (uVar3 == 1) goto LAB_00112280;
    if (uVar3 != 3) {
      if (uVar3 != 5) {
        return uVar3;
      }
      *(undefined2 *)(pcVar4 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (ulong)(n % 100) * 2);
      pcVar4 = pcVar4 + -2;
      uVar3 = 5;
      n = n / 100;
    }
  }
  uVar2 = n / 100;
  *(undefined2 *)(pcVar4 + -2) =
       *(undefined2 *)
        (
        "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
        + (ulong)(n % 100) * 2);
  pcVar4 = pcVar4 + -2;
LAB_00112280:
  pcVar4[-1] = (char)uVar2 + '0';
  return uVar3;
}

Assistant:

static int print_uint16(uint16_t n, char *p)
{
    int k = 0;
    const char *dp;

    if (n >= 1000) {
        if(n >= 10000) {
            k = 5;
        } else {
            k = 4;
        }
    } else {
        if(n >= 100) {
            k = 3;
        } else if(n >= 10) {
            k = 2;
        } else {
            k = 1;
        }
    }
    p += k;
    *p = '\0';
    if (k & 1) {
        switch (k) {
        case 5:
            __print_stage();
	    pattribute(fallthrough);
        case 3:
            __print_stage();
	    pattribute(fallthrough);
        case 1:
            p[-1] = (char)n + '0';
        }
    } else {
        switch (k) {
        case 4:
            __print_stage();
	    pattribute(fallthrough);
        case 2:
            __print_stage();
        }
    }
    return k;
}